

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::Snapshot::SetDefaultDefinitions(Snapshot *this)

{
  uint uVar1;
  char *pcVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  char temp [1024];
  allocator local_44a;
  allocator local_449;
  string local_448;
  string local_428;
  string local_408 [32];
  
  std::__cxx11::string::string((string *)local_408,"UNIX",(allocator *)&local_428);
  std::__cxx11::string::string((string *)&local_448,"1",&local_44a);
  SetDefinition(this,local_408,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)local_408);
  std::__cxx11::string::string((string *)local_408,"CMAKE_HOST_UNIX",(allocator *)&local_428);
  std::__cxx11::string::string((string *)&local_448,"1",&local_44a);
  SetDefinition(this,local_408,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)local_408);
  uVar1 = cmVersion::GetMinorVersion();
  sprintf((char *)local_408,"%d",(ulong)uVar1);
  std::__cxx11::string::string((string *)&local_448,"CMAKE_MINOR_VERSION",&local_44a);
  std::__cxx11::string::string((string *)&local_428,(char *)local_408,&local_449);
  SetDefinition(this,&local_448,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  uVar1 = cmVersion::GetMajorVersion();
  sprintf((char *)local_408,"%d",(ulong)uVar1);
  std::__cxx11::string::string((string *)&local_448,"CMAKE_MAJOR_VERSION",&local_44a);
  std::__cxx11::string::string((string *)&local_428,(char *)local_408,&local_449);
  SetDefinition(this,&local_448,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  uVar1 = cmVersion::GetPatchVersion();
  sprintf((char *)local_408,"%d",(ulong)uVar1);
  std::__cxx11::string::string((string *)&local_448,"CMAKE_PATCH_VERSION",&local_44a);
  std::__cxx11::string::string((string *)&local_428,(char *)local_408,&local_449);
  SetDefinition(this,&local_448,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  uVar1 = cmVersion::GetTweakVersion();
  sprintf((char *)local_408,"%d",(ulong)uVar1);
  std::__cxx11::string::string((string *)&local_448,"CMAKE_TWEAK_VERSION",&local_44a);
  std::__cxx11::string::string((string *)&local_428,(char *)local_408,&local_449);
  SetDefinition(this,&local_448,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::string((string *)&local_448,"CMAKE_VERSION",&local_44a);
  pcVar2 = cmVersion::GetCMakeVersion();
  std::__cxx11::string::string((string *)&local_428,pcVar2,&local_449);
  SetDefinition(this,&local_448,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::string((string *)&local_448,"CMAKE_FILES_DIRECTORY",&local_44a);
  std::__cxx11::string::string((string *)&local_428,"/CMakeFiles",&local_449);
  SetDefinition(this,&local_448,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::__cxx11::string::string
            ((string *)&local_448,"INCLUDE_REGULAR_EXPRESSION",(allocator *)&local_428);
  cmPropertyMap::SetProperty(&pBVar4->Properties,&local_448,"^.*$");
  std::__cxx11::string::~string((string *)&local_448);
  return;
}

Assistant:

void cmState::Snapshot::SetDefaultDefinitions()
{
  /* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
    With CMake must separate between target and host platform. In most cases
    the tests for WIN32, UNIX and APPLE will be for the target system, so an
    additional set of variables for the host system is required ->
    CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
    WIN32, UNIX and APPLE are now set in the platform files in
    Modules/Platforms/.
    To keep cmake scripts (-P) and custom language and compiler modules
    working, these variables are still also set here in this place, but they
    will be reset in CMakeSystemSpecificInformation.cmake before the platform
    files are executed. */
  #if defined(_WIN32)
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  #else
    this->SetDefinition("UNIX", "1");
    this->SetDefinition("CMAKE_HOST_UNIX", "1");
  #endif
  #if defined(__CYGWIN__)
    if(cmSystemTools::IsOn(cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32")))
      {
      this->SetDefinition("WIN32", "1");
      this->SetDefinition("CMAKE_HOST_WIN32", "1");
      }
  #endif
  #if defined(__APPLE__)
    this->SetDefinition("APPLE", "1");
    this->SetDefinition("CMAKE_HOST_APPLE", "1");
  #endif

    char temp[1024];
    sprintf(temp, "%d", cmVersion::GetMinorVersion());
    this->SetDefinition("CMAKE_MINOR_VERSION", temp);
    sprintf(temp, "%d", cmVersion::GetMajorVersion());
    this->SetDefinition("CMAKE_MAJOR_VERSION", temp);
    sprintf(temp, "%d", cmVersion::GetPatchVersion());
    this->SetDefinition("CMAKE_PATCH_VERSION", temp);
    sprintf(temp, "%d", cmVersion::GetTweakVersion());
    this->SetDefinition("CMAKE_TWEAK_VERSION", temp);
    this->SetDefinition("CMAKE_VERSION",
                                      cmVersion::GetCMakeVersion());

    this->SetDefinition("CMAKE_FILES_DIRECTORY",
                        cmake::GetCMakeFilesDirectory());

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory
      ->Properties.SetProperty("INCLUDE_REGULAR_EXPRESSION", "^.*$");
}